

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Company.cpp
# Opt level: O3

void __thiscall Company::payForService(Company *this)

{
  Employee *this_00;
  int iVar1;
  long lVar2;
  string local_b0;
  Address local_90;
  
  iVar1 = Boss::getNumberOfEmployees(this->boss);
  if (0 < iVar1) {
    lVar2 = 0;
    do {
      Person::getAddress(&local_90,&this->employees[lVar2]->super_Person);
      Address::getCity_abi_cxx11_(&local_b0,&local_90);
      iVar1 = std::__cxx11::string::compare((char *)&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90.street._M_dataplus._M_p != &local_90.street.field_2) {
        operator_delete(local_90.street._M_dataplus._M_p,
                        local_90.street.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90.city._M_dataplus._M_p != &local_90.city.field_2) {
        operator_delete(local_90.city._M_dataplus._M_p,
                        local_90.city.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90.country._M_dataplus._M_p != &local_90.country.field_2) {
        operator_delete(local_90.country._M_dataplus._M_p,
                        local_90.country.field_2._M_allocated_capacity + 1);
      }
      if (iVar1 != 0) {
        this_00 = this->employees[lVar2];
        iVar1 = Employee::getHourWork(this_00);
        Employee::setHourWork(this_00,iVar1 + 7);
      }
      lVar2 = lVar2 + 1;
      iVar1 = Boss::getNumberOfEmployees(this->boss);
    } while (lVar2 < iVar1);
  }
  return;
}

Assistant:

void Company::payForService() {
    for (int i = 0; i < boss->getNumberOfEmployees(); ++i) {
        if (employees[i]->getAddress().getCity() != "Tehran"){
            employees[i]->setHourWork(employees[i]->getHourWork()+7);
        }
    }
}